

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O1

void __thiscall SAUF4C<RemSP>::FirstScan(SAUF4C<RemSP> *this)

{
  long lVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long local_50;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
  lVar8 = (long)*(int *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  if (0 < lVar8) {
    local_50 = -1;
    lVar10 = 0;
    do {
      if (0 < (int)uVar2) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
        lVar5 = *(long *)&pMVar3->field_0x10;
        lVar6 = **(long **)&pMVar3->field_0x48;
        lVar11 = *(long *)&pMVar4->field_0x10;
        lVar9 = **(long **)&pMVar4->field_0x48;
        lVar1 = lVar11 + lVar9 * lVar10;
        lVar13 = lVar1 + -4;
        lVar11 = lVar9 * local_50 + lVar11;
        lVar9 = lVar6 * lVar10 + lVar5;
        uVar12 = 0;
        do {
          if (*(char *)(lVar9 + uVar12) != '\0') {
            if ((lVar10 == 0) || (*(char *)(lVar6 * local_50 + lVar5 + uVar12) == '\0')) {
              if ((uVar12 == 0) || (*(char *)(lVar9 + -1 + uVar12) == '\0')) {
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar7 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else {
                uVar7 = *(uint *)(lVar13 + uVar12 * 4);
              }
            }
            else if ((uVar12 == 0) || (*(char *)(lVar9 + -1 + uVar12) == '\0')) {
              uVar7 = *(uint *)(lVar11 + uVar12 * 4);
            }
            else {
              uVar7 = RemSP::Merge(*(uint *)(lVar11 + uVar12 * 4),*(uint *)(lVar13 + uVar12 * 4));
            }
            *(uint *)(lVar1 + uVar12 * 4) = uVar7;
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      lVar10 = lVar10 + 1;
      local_50 = local_50 + 1;
    } while (lVar10 != lVar8);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_4 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_5 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_4c_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }